

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPPacket.h
# Opt level: O2

void __thiscall SNMPPacket::SNMPPacket(SNMPPacket *this,SNMPPacket *packet)

{
  this->_vptr_SNMPPacket = (_func_int **)&PTR__SNMPPacket_00117738;
  this->reuse = false;
  (this->requestIDPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->requestIDPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->snmpVersionPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->snmpVersionPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->communityStringPtr).super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->communityStringPtr).super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->communityStringPtr).super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi + 4) = 0;
  *(undefined8 *)((long)&this->requestID + 4) = 0;
  (this->communityString)._M_dataplus._M_p = (pointer)&(this->communityString).field_2;
  (this->communityString)._M_string_length = 0;
  (this->communityString).field_2._M_local_buf[0] = '\0';
  std::_Deque_base<VarBind,_std::allocator<VarBind>_>::_Deque_base
            (&(this->varbindList).super__Deque_base<VarBind,_std::allocator<VarBind>_>);
  this->errorStatus = (ErrorStatus)0x0;
  this->errorIndex = (ErrorIndex)0x0;
  this->packet = (ComplexType *)0x0;
  setRequestID(this,packet->requestID);
  setVersion(this,packet->snmpVersion);
  setCommunityString(this,&packet->communityString);
  if ((packet->requestIDPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->requestIDPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>,
               &(packet->requestIDPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>);
  }
  if ((packet->snmpVersionPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->snmpVersionPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>,
               &(packet->snmpVersionPtr).super___shared_ptr<IntegerType,_(__gnu_cxx::_Lock_policy)2>
              );
  }
  if ((packet->communityStringPtr).super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (element_type *)0x0) {
    std::__shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->communityStringPtr).super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>
               ,&(packet->communityStringPtr).
                 super___shared_ptr<OctetType,_(__gnu_cxx::_Lock_policy)2>);
    return;
  }
  return;
}

Assistant:

explicit SNMPPacket(const SNMPPacket& packet){
        this->setRequestID(packet.requestID);
        this->setVersion(packet.snmpVersion);
        this->setCommunityString(packet.communityString);

        // Provide reusable ASN containers if required
        if(packet.requestIDPtr){
            this->requestIDPtr = packet.requestIDPtr;
        }

        if(packet.snmpVersionPtr){
            this->snmpVersionPtr = packet.snmpVersionPtr;
        }

        if(packet.communityStringPtr){
            this->communityStringPtr = packet.communityStringPtr;
        }
    }